

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O0

void __thiscall
feintrack::SimpleLeftObjectsDetector::CheckShadyLeftObject
          (SimpleLeftObjectsDetector *this,CTrackingObject *obj)

{
  uint real_obj_uid;
  bool bVar1;
  int iVar2;
  int iVar3;
  int right;
  int top;
  int bottom;
  pointer pCVar4;
  const_iterator local_58;
  _List_node_base *local_50;
  _Self local_48;
  _Self local_40;
  iterator iter;
  CShadyLeftObj new_obj;
  CTrackingObject *obj_local;
  SimpleLeftObjectsDetector *this_local;
  
  iVar2 = CTrackingObject::get_left_frames(obj);
  if (iVar2 != this->left_object_time0) {
    return;
  }
  real_obj_uid = obj->uid;
  iVar2 = CTrackingObject::get_left_frames(obj);
  iVar3 = CTrackingObject::get_left(obj);
  right = CTrackingObject::get_right(obj);
  top = CTrackingObject::get_top(obj);
  bottom = CTrackingObject::get_bottom(obj);
  CShadyLeftObj::CShadyLeftObj
            ((CShadyLeftObj *)((long)&iter._M_node + 4),real_obj_uid,iVar2,iVar3,right,top,bottom);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
       begin(&this->shady_left_objects);
  do {
    while( true ) {
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
           end(&this->shady_left_objects);
      bVar1 = std::operator!=(&local_40,&local_48);
      if (!bVar1) {
        std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
        push_back(&this->shady_left_objects,(value_type *)((long)&iter._M_node + 4));
        CTrackingObject::set_left_frames(obj,iter._M_node._4_4_);
        return;
      }
      pCVar4 = std::_List_iterator<feintrack::CShadyLeftObj>::operator->(&local_40);
      iVar2 = TRECT_<int>::center_x(&(pCVar4->super_CLeftObjView).rect);
      iVar3 = CTrackingObject::get_last_center_x(obj);
      iVar2 = iVar2 - iVar3;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      iVar3 = CTrackingObject::get_left_epsilon(obj);
      if (SBORROW4(iVar2,iVar3 * 2) != iVar2 + iVar3 * -2 < 0) break;
LAB_0013466a:
      std::_List_iterator<feintrack::CShadyLeftObj>::operator++(&local_40);
    }
    pCVar4 = std::_List_iterator<feintrack::CShadyLeftObj>::operator->(&local_40);
    iVar2 = TRECT_<int>::center_y(&(pCVar4->super_CLeftObjView).rect);
    iVar3 = CTrackingObject::get_last_center_y(obj);
    iVar2 = iVar2 - iVar3;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    iVar3 = CTrackingObject::get_left_epsilon(obj);
    if (SBORROW4(iVar2,iVar3 * 2) == iVar2 + iVar3 * -2 < 0) goto LAB_0013466a;
    pCVar4 = std::_List_iterator<feintrack::CShadyLeftObj>::operator->(&local_40);
    iter._M_node._4_4_ = (pCVar4->super_CLeftObjView).life_time + iter._M_node._4_4_;
    std::_List_const_iterator<feintrack::CShadyLeftObj>::_List_const_iterator(&local_58,&local_40);
    local_50 = (_List_node_base *)
               std::__cxx11::
               list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::erase
                         (&this->shady_left_objects,local_58);
    local_40._M_node = local_50;
  } while( true );
}

Assistant:

void SimpleLeftObjectsDetector::CheckShadyLeftObject(
        CTrackingObject& obj
        )
{
    if (obj.get_left_frames() == left_object_time0)
    {
        CShadyLeftObj new_obj(obj.uid, obj.get_left_frames(), obj.get_left(), obj.get_right(), obj.get_top(), obj.get_bottom());
        // Если существует объект с центром в некоторой окрестности, то его удаляем а время складываем
        for (auto iter = shady_left_objects.begin(); iter != shady_left_objects.end();)
        {
            if ((abs(iter->rect.center_x() - obj.get_last_center_x()) < 2 * obj.get_left_epsilon()) &&
                    (abs(iter->rect.center_y() - obj.get_last_center_y()) < 2 * obj.get_left_epsilon()))
            {
                new_obj.life_time += iter->life_time;
                iter = shady_left_objects.erase(iter);
            }
            else
            {
                ++iter;
            }
        }
        shady_left_objects.push_back(new_obj);
        obj.set_left_frames(new_obj.life_time);
    }
}